

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConvexAlgorithm.cpp
# Opt level: O3

btScalar __thiscall
btConvexConvexAlgorithm::calculateTimeOfImpact
          (btConvexConvexAlgorithm *this,btCollisionObject *col0,btCollisionObject *col1,
          btDispatcherInfo *dispatchInfo,btManifoldResult *resultOut)

{
  btScalar bVar1;
  btCollisionShape *pbVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  btGjkConvexCast ccd1;
  btSphereShape sphere1;
  CastResult result;
  btVoronoiSimplexSolver voronoiSimplex;
  float local_2e0;
  btGjkConvexCast local_2c0;
  btConvexInternalShape local_2a0;
  CastResult local_258;
  btVoronoiSimplexSolver local_198;
  
  fVar4 = (col0->m_interpolationWorldTransform).m_origin.m_floats[0] -
          (col0->m_worldTransform).m_origin.m_floats[0];
  fVar5 = (col0->m_interpolationWorldTransform).m_origin.m_floats[1] -
          (col0->m_worldTransform).m_origin.m_floats[1];
  fVar6 = (col0->m_interpolationWorldTransform).m_origin.m_floats[2] -
          (col0->m_worldTransform).m_origin.m_floats[2];
  if (((fVar6 * fVar6 + fVar4 * fVar4 + fVar5 * fVar5 <
        col0->m_ccdMotionThreshold * col0->m_ccdMotionThreshold) &&
      (fVar4 = (col1->m_interpolationWorldTransform).m_origin.m_floats[2] -
               (col1->m_worldTransform).m_origin.m_floats[2],
      fVar5 = (col1->m_interpolationWorldTransform).m_origin.m_floats[0] -
              (col1->m_worldTransform).m_origin.m_floats[0],
      fVar6 = (col1->m_interpolationWorldTransform).m_origin.m_floats[1] -
              (col1->m_worldTransform).m_origin.m_floats[1],
      fVar4 * fVar4 + fVar5 * fVar5 + fVar6 * fVar6 <
      col1->m_ccdMotionThreshold * col1->m_ccdMotionThreshold)) || (disableCcd)) {
    local_2e0 = 1.0;
  }
  else {
    pbVar2 = col0->m_collisionShape;
    bVar1 = col1->m_ccdSweptSphereRadius;
    btConvexInternalShape::btConvexInternalShape(&local_2a0);
    local_2a0.super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape =
         (_func_int **)&PTR__btConvexShape_0021e930;
    local_2a0.super_btConvexShape.super_btCollisionShape.m_shapeType = 8;
    local_258._vptr_CastResult = (_func_int **)&PTR_DebugDraw_0021bc78;
    local_258.m_fraction = 1e+18;
    local_258.m_debugDrawer = (btIDebugDraw *)0x0;
    local_258.m_allowedPenetration = 0.0;
    local_198.m_equalVertexThreshold = 0.0001;
    local_198.m_cachedBC.m_usedVertices._0_1_ = 0;
    local_2a0.m_implicitShapeDimensions.m_floats[0] = bVar1;
    local_2a0.m_collisionMargin = bVar1;
    btGjkConvexCast::btGjkConvexCast
              (&local_2c0,(btConvexShape *)pbVar2,&local_2a0.super_btConvexShape,&local_198);
    bVar3 = btGjkConvexCast::calcTimeOfImpact
                      (&local_2c0,&col0->m_worldTransform,&col0->m_interpolationWorldTransform,
                       &col1->m_worldTransform,&col1->m_interpolationWorldTransform,&local_258);
    if (bVar3) {
      if (local_258.m_fraction < col0->m_hitFraction) {
        col0->m_hitFraction = local_258.m_fraction;
      }
      if (local_258.m_fraction < col1->m_hitFraction) {
        col1->m_hitFraction = local_258.m_fraction;
      }
      local_2e0 = 1.0;
      fVar4 = local_258.m_fraction;
      if (1.0 <= local_258.m_fraction) {
        fVar4 = local_2e0;
      }
    }
    else {
      fVar4 = 1.0;
    }
    local_2e0 = fVar4;
    btConvexCast::~btConvexCast(&local_2c0.super_btConvexCast);
    btConvexShape::~btConvexShape(&local_2a0.super_btConvexShape);
    pbVar2 = col1->m_collisionShape;
    bVar1 = col0->m_ccdSweptSphereRadius;
    btConvexInternalShape::btConvexInternalShape(&local_2a0);
    local_2a0.super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape =
         (_func_int **)&PTR__btConvexShape_0021e930;
    local_2a0.super_btConvexShape.super_btCollisionShape.m_shapeType = 8;
    local_258._vptr_CastResult = (_func_int **)&PTR_DebugDraw_0021bc78;
    local_258.m_fraction = 1e+18;
    local_258.m_debugDrawer = (btIDebugDraw *)0x0;
    local_258.m_allowedPenetration = 0.0;
    local_198.m_equalVertexThreshold = 0.0001;
    local_198.m_cachedBC.m_usedVertices._0_1_ = 0;
    local_2a0.m_implicitShapeDimensions.m_floats[0] = bVar1;
    local_2a0.m_collisionMargin = bVar1;
    btGjkConvexCast::btGjkConvexCast
              (&local_2c0,&local_2a0.super_btConvexShape,(btConvexShape *)pbVar2,&local_198);
    bVar3 = btGjkConvexCast::calcTimeOfImpact
                      (&local_2c0,&col0->m_worldTransform,&col0->m_interpolationWorldTransform,
                       &col1->m_worldTransform,&col1->m_interpolationWorldTransform,&local_258);
    if (bVar3) {
      if (local_258.m_fraction < col0->m_hitFraction) {
        col0->m_hitFraction = local_258.m_fraction;
      }
      if (local_258.m_fraction < col1->m_hitFraction) {
        col1->m_hitFraction = local_258.m_fraction;
      }
      if (local_258.m_fraction < local_2e0) {
        local_2e0 = local_258.m_fraction;
      }
    }
    btConvexCast::~btConvexCast(&local_2c0.super_btConvexCast);
    btConvexShape::~btConvexShape(&local_2a0.super_btConvexShape);
  }
  return local_2e0;
}

Assistant:

btScalar	btConvexConvexAlgorithm::calculateTimeOfImpact(btCollisionObject* col0,btCollisionObject* col1,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	(void)resultOut;
	(void)dispatchInfo;
	///Rather then checking ALL pairs, only calculate TOI when motion exceeds threshold
    
	///Linear motion for one of objects needs to exceed m_ccdSquareMotionThreshold
	///col0->m_worldTransform,
	btScalar resultFraction = btScalar(1.);


	btScalar squareMot0 = (col0->getInterpolationWorldTransform().getOrigin() - col0->getWorldTransform().getOrigin()).length2();
	btScalar squareMot1 = (col1->getInterpolationWorldTransform().getOrigin() - col1->getWorldTransform().getOrigin()).length2();
    
	if (squareMot0 < col0->getCcdSquareMotionThreshold() &&
		squareMot1 < col1->getCcdSquareMotionThreshold())
		return resultFraction;

	if (disableCcd)
		return btScalar(1.);


	//An adhoc way of testing the Continuous Collision Detection algorithms
	//One object is approximated as a sphere, to simplify things
	//Starting in penetration should report no time of impact
	//For proper CCD, better accuracy and handling of 'allowed' penetration should be added
	//also the mainloop of the physics should have a kind of toi queue (something like Brian Mirtich's application of Timewarp for Rigidbodies)

		
	/// Convex0 against sphere for Convex1
	{
		btConvexShape* convex0 = static_cast<btConvexShape*>(col0->getCollisionShape());

		btSphereShape	sphere1(col1->getCcdSweptSphereRadius()); //todo: allow non-zero sphere sizes, for better approximation
		btConvexCast::CastResult result;
		btVoronoiSimplexSolver voronoiSimplex;
		//SubsimplexConvexCast ccd0(&sphere,min0,&voronoiSimplex);
		///Simplification, one object is simplified as a sphere
		btGjkConvexCast ccd1( convex0 ,&sphere1,&voronoiSimplex);
		//ContinuousConvexCollision ccd(min0,min1,&voronoiSimplex,0);
		if (ccd1.calcTimeOfImpact(col0->getWorldTransform(),col0->getInterpolationWorldTransform(),
			col1->getWorldTransform(),col1->getInterpolationWorldTransform(),result))
		{
		
			//store result.m_fraction in both bodies
		
			if (col0->getHitFraction()> result.m_fraction)
				col0->setHitFraction( result.m_fraction );

			if (col1->getHitFraction() > result.m_fraction)
				col1->setHitFraction( result.m_fraction);

			if (resultFraction > result.m_fraction)
				resultFraction = result.m_fraction;

		}
		
		


	}

	/// Sphere (for convex0) against Convex1
	{
		btConvexShape* convex1 = static_cast<btConvexShape*>(col1->getCollisionShape());

		btSphereShape	sphere0(col0->getCcdSweptSphereRadius()); //todo: allow non-zero sphere sizes, for better approximation
		btConvexCast::CastResult result;
		btVoronoiSimplexSolver voronoiSimplex;
		//SubsimplexConvexCast ccd0(&sphere,min0,&voronoiSimplex);
		///Simplification, one object is simplified as a sphere
		btGjkConvexCast ccd1(&sphere0,convex1,&voronoiSimplex);
		//ContinuousConvexCollision ccd(min0,min1,&voronoiSimplex,0);
		if (ccd1.calcTimeOfImpact(col0->getWorldTransform(),col0->getInterpolationWorldTransform(),
			col1->getWorldTransform(),col1->getInterpolationWorldTransform(),result))
		{
		
			//store result.m_fraction in both bodies
		
			if (col0->getHitFraction()	> result.m_fraction)
				col0->setHitFraction( result.m_fraction);

			if (col1->getHitFraction() > result.m_fraction)
				col1->setHitFraction( result.m_fraction);

			if (resultFraction > result.m_fraction)
				resultFraction = result.m_fraction;

		}
	}
	
	return resultFraction;

}